

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knetfile.c
# Opt level: O2

knetFile * kftp_parse_url(char *fn,char *mode)

{
  int iVar1;
  knetFile *pkVar2;
  char *pcVar3;
  char *pcVar4;
  size_t sVar5;
  char *__s;
  long lVar6;
  
  iVar1 = strncmp(fn,"ftp://",6);
  if (iVar1 == 0) {
    lVar6 = 0;
    for (__s = fn + 6; *__s != '\0'; __s = __s + 1) {
      if (*__s == '/') {
        pkVar2 = (knetFile *)calloc(1,0x80);
        pkVar2->type = 2;
        pkVar2->fd = -1;
        pcVar3 = strdup("21");
        pkVar2->port = pcVar3;
        pcVar3 = (char *)calloc(lVar6 + 0x100000000 >> 0x20,1);
        pkVar2->host = pcVar3;
        pcVar4 = strchr(mode,99);
        if (pcVar4 != (char *)0x0) {
          pkVar2->no_reconnect = 1;
        }
        strncpy(pcVar3,fn + 6,lVar6 >> 0x20);
        sVar5 = strlen(__s);
        pcVar3 = (char *)calloc(sVar5 + 8,1);
        pkVar2->retr = pcVar3;
        sprintf(pcVar3,"RETR %s\r\n",__s);
        sVar5 = strlen(__s);
        pcVar3 = (char *)calloc(sVar5 + 8,1);
        pkVar2->size_cmd = pcVar3;
        sprintf(pcVar3,"SIZE %s\r\n",__s);
        return pkVar2;
      }
      lVar6 = lVar6 + 0x100000000;
    }
  }
  return (knetFile *)0x0;
}

Assistant:

knetFile *kftp_parse_url(const char *fn, const char *mode)
{
	knetFile *fp;
	char *p;
	int l;
	if (strstr(fn, "ftp://") != fn) return 0;
	for (p = (char*)fn + 6; *p && *p != '/'; ++p);
	if (*p != '/') return 0;
	l = p - fn - 6;
	fp = (knetFile*)calloc(1, sizeof(knetFile));
	fp->type = KNF_TYPE_FTP;
	fp->fd = -1;
	/* the Linux/Mac version of socket_connect() also recognizes a port
	 * like "ftp", but the Windows version does not. */
	fp->port = strdup("21");
	fp->host = (char*)calloc(l + 1, 1);
	if (strchr(mode, 'c')) fp->no_reconnect = 1;
	strncpy(fp->host, fn + 6, l);
	fp->retr = (char*)calloc(strlen(p) + 8, 1);
	sprintf(fp->retr, "RETR %s\r\n", p);
    fp->size_cmd = (char*)calloc(strlen(p) + 8, 1);
    sprintf(fp->size_cmd, "SIZE %s\r\n", p);
	fp->seek_offset = 0;
	return fp;
}